

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace_plugin.cpp
# Opt level: O1

int backtrace_plugin(void *loader,void *handle)

{
  bool bVar1;
  
  bVar1 = signal_handling._loaded;
  if (!signal_handling._loaded) {
    log_write_impl_va("metacall",0x24,"backtrace_plugin",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugins/backtrace_plugin/source/backtrace_plugin.cpp"
                      ,3,
                      "Backtrace plugin failed to load, you need unwind/libunwind for stacktracing and libbfd/libdw/libdwarf for the debug information. Install the required libraries and recompile to utilise the backtrace plugin. For more information visit https://github.com/bombela/backward-cpp"
                      ,0);
  }
  return (uint)!bVar1;
}

Assistant:

int backtrace_plugin(void *loader, void *handle)
{
	(void)loader;
	(void)handle;

	if (signal_handling.loaded() == false)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Backtrace plugin failed to load, you need unwind/libunwind for stacktracing and libbfd/libdw/libdwarf for the debug information. Install the required libraries and recompile to utilise the backtrace plugin. For more information visit https://github.com/bombela/backward-cpp");
		return 1;
	}

	return 0;
}